

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O0

bool __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::SaveType
          (KotlinKMPGenerator *this,string *defname,Namespace *ns,string *classcode,
          bool needs_includes)

{
  long lVar1;
  char *pcVar2;
  ulong uVar3;
  string local_198;
  undefined1 local_178 [8];
  string filename;
  string dirs;
  undefined1 local_118 [8];
  string namespace_name;
  string local_f0;
  undefined1 local_d0 [8];
  string qualified;
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  string code;
  bool needs_includes_local;
  string *classcode_local;
  Namespace *ns_local;
  string *defname_local;
  KotlinKMPGenerator *this_local;
  
  code.field_2._M_local_buf[0xf] = needs_includes;
  lVar1 = std::__cxx11::string::length();
  if (lVar1 == 0) {
    this_local._7_1_ = true;
  }
  else {
    pcVar2 = BaseGenerator::FlatBuffersGeneratedWarning();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,pcVar2,&local_99);
    std::operator+(&local_78,"// ",&local_98);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   &local_78,"\n\n");
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"",(allocator<char> *)(namespace_name.field_2._M_local_buf + 0xf)
              );
    Namespace::GetFullyQualifiedName((string *)local_d0,ns,&local_f0,1000);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator((allocator<char> *)(namespace_name.field_2._M_local_buf + 0xf))
    ;
    IdlNamer::Namespace_abi_cxx11_((string *)local_118,&this->namer_,ns);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&dirs.field_2 + 8),"package ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118)
      ;
      std::__cxx11::string::operator+=((string *)local_58,(string *)(dirs.field_2._M_local_buf + 8))
      ;
      std::__cxx11::string::~string((string *)(dirs.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=((string *)local_58,"\n\n");
    }
    if ((code.field_2._M_local_buf[0xf] & 1U) != 0) {
      std::__cxx11::string::operator+=
                ((string *)local_58,"import com.google.flatbuffers.kotlin.*\n");
    }
    std::__cxx11::string::operator+=((string *)local_58,"import kotlin.jvm.JvmInline\n");
    std::__cxx11::string::operator+=((string *)local_58,(string *)classcode);
    IdlNamer::Directories_abi_cxx11_
              ((string *)((long)&filename.field_2 + 8),&this->namer_,ns,None,kUnknown);
    EnsureDirExists((string *)((long)&filename.field_2 + 8));
    Namer::File(&local_198,&(this->namer_).super_Namer,defname,Suffix);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&filename.field_2 + 8),&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    this_local._7_1_ = SaveFile(pcVar2,(string *)local_58,false);
    std::__cxx11::string::~string((string *)local_178);
    std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)local_58);
  }
  return this_local._7_1_;
}

Assistant:

bool SaveType(const std::string &defname, const Namespace &ns,
                const std::string &classcode, bool needs_includes) const {
    if (!classcode.length()) return true;

    std::string code =
        "// " + std::string(FlatBuffersGeneratedWarning()) + "\n\n";
    auto qualified = ns.GetFullyQualifiedName("");
    std::string namespace_name = namer_.Namespace(ns);
    if (!namespace_name.empty()) {
      code += "package " + namespace_name;
      code += "\n\n";
    }
    if (needs_includes) { code += "import com.google.flatbuffers.kotlin.*\n"; }
    code += "import kotlin.jvm.JvmInline\n";
    code += classcode;
    const std::string dirs =
        namer_.Directories(ns, SkipDir::None, Case::kUnknown);
    EnsureDirExists(dirs);
    const std::string filename =
        dirs + namer_.File(defname, /*skips=*/SkipFile::Suffix);
    return SaveFile(filename.c_str(), code, false);
  }